

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O1

void __thiscall OpenMD::NPT::moveB(NPT *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  pointer pVVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Thermo *this_00;
  uint i_2;
  Molecule *pMVar11;
  undefined1 *puVar12;
  uint i_1;
  long lVar13;
  StuntDouble *pSVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  pointer ppSVar18;
  uint uVar19;
  int iVar20;
  pair<double,_double> pVar21;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_3;
  MoleculeIterator i;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector3d frc;
  Vector3d Tb;
  Vector3d vel;
  Vector3d sc;
  Vector3d ji;
  Vector3d local_198;
  Vector3d local_178;
  MoleculeIterator local_158;
  pair<double,_double> *local_150;
  double local_148 [4];
  double local_128 [4];
  Thermo *local_108;
  double local_100;
  ulong local_f8;
  double local_f0;
  double local_e8 [4];
  double local_c8 [4];
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88 [4];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  undefined8 uStack_40;
  
  iVar20 = 0;
  local_158._M_node = (_Base_ptr)0x0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_58 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_98 = 0.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  pVar21 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_100 = pVar21.first;
  (this->thermostat).first = local_100;
  (this->thermostat).second = pVar21.second;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  pMVar11 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_158);
  if (pMVar11 != (Molecule *)0x0) {
    do {
      ppSVar18 = (pMVar11->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar18 ==
          (pMVar11->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar14 = (StuntDouble *)0x0;
      }
      else {
        pSVar14 = *ppSVar18;
      }
      if (pSVar14 != (StuntDouble *)0x0) {
        pVVar5 = (this->oldVel).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->oldJi).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)iVar20 * 0x18;
        do {
          ppSVar18 = ppSVar18 + 1;
          pSVar7 = pSVar14->snapshotMan_->currentSnapshot_;
          lVar16 = (long)pSVar14->localIndex_;
          lVar13 = *(long *)((long)&(pSVar7->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
          puVar1 = (undefined8 *)(lVar13 + lVar16 * 0x18);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          *(undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
               *(undefined8 *)(lVar13 + 0x10 + lVar16 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          if (pSVar14->objType_ - otDAtom < 2) {
            lVar13 = *(long *)((long)&(pSVar7->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_)
            ;
            puVar1 = (undefined8 *)(lVar13 + lVar16 * 0x18);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
                 *(undefined8 *)(lVar13 + 0x10 + lVar16 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15);
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
          }
          if (ppSVar18 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar18;
          }
          lVar15 = lVar15 + 0x18;
          iVar20 = iVar20 + 1;
        } while (pSVar14 != (StuntDouble *)0x0);
      }
      pMVar11 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_158)
      ;
    } while (pMVar11 != (Molecule *)0x0);
  }
  local_150 = &this->thermostat;
  local_108 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar8 = Thermo::getVolume(local_108);
  this->instaVol = RVar8;
  if (0 < this->maxIterNum_) {
    uVar17 = 0;
    do {
      this_00 = local_108;
      local_f8 = uVar17;
      RVar8 = Thermo::getTemperature(local_108);
      this->instaTemp = RVar8;
      RVar8 = Thermo::getPressure(this_00);
      this->instaPress = RVar8;
      local_48 = (this->thermostat).first;
      uStack_40 = 0;
      (this->thermostat).first =
           ((this->instaTemp / this->targetTemp + -1.0) *
           (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 + local_100;
      (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x16])(this);
      (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
      pMVar11 = SimInfo::beginMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_158)
      ;
      if (pMVar11 != (Molecule *)0x0) {
        uVar17 = 0;
        do {
          ppSVar18 = (pMVar11->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar18 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar18;
          }
          if (pSVar14 != (StuntDouble *)0x0) {
            uVar17 = (ulong)(int)uVar17;
            lVar15 = uVar17 * 0x18;
            do {
              lVar13 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              local_e8[2] = *(double *)(lVar13 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar13 + (long)pSVar14->localIndex_ * 0x18);
              local_e8[0] = *pdVar2;
              local_e8[1] = pdVar2[1];
              local_f0 = pSVar14->mass_;
              (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x11])
                        (this,local_88,uVar17 & 0xffffffff);
              pVVar5 = (this->oldVel).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
              local_128[0] = 0.0;
              local_128[1] = 0.0;
              local_128[2] = 0.0;
              lVar13 = 0;
              do {
                local_128[lVar13] = local_e8[lVar13] * ((dVar3 * 0.0004184) / local_f0);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_198.super_Vector<double,_3U>.data_[0] = 0.0;
              local_198.super_Vector<double,_3U>.data_[1] = 0.0;
              local_198.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_198.super_Vector<double,_3U>.data_[lVar13] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar13 * 8 + lVar15) +
                     local_128[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_148[0] = 0.0;
              local_148[1] = 0.0;
              local_148[2] = 0.0;
              lVar13 = 0;
              do {
                local_148[lVar13] = local_88[lVar13] * dVar3;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_178.super_Vector<double,_3U>.data_[0] = 0.0;
              local_178.super_Vector<double,_3U>.data_[1] = 0.0;
              local_178.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_178.super_Vector<double,_3U>.data_[lVar13] =
                     local_198.super_Vector<double,_3U>.data_[lVar13] - local_148[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_98 = local_178.super_Vector<double,_3U>.data_[2];
              local_a8 = local_178.super_Vector<double,_3U>.data_[0];
              dStack_a0 = local_178.super_Vector<double,_3U>.data_[1];
              pSVar7 = pSVar14->snapshotMan_->currentSnapshot_;
              lVar16 = (long)pSVar14->localIndex_;
              lVar13 = *(long *)((long)&(pSVar7->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              *(double *)(lVar13 + 0x10 + lVar16 * 0x18) =
                   local_178.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar13 + lVar16 * 0x18);
              *pdVar2 = local_178.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_178.super_Vector<double,_3U>.data_[1];
              if (pSVar14->objType_ - otDAtom < 2) {
                puVar12 = (undefined1 *)
                          (lVar16 * 0x18 +
                          *(long *)((long)&(pSVar7->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar14->storage_));
                local_198.super_Vector<double,_3U>.data_[0] = 0.0;
                local_198.super_Vector<double,_3U>.data_[1] = 0.0;
                local_198.super_Vector<double,_3U>.data_[2] = 0.0;
                if ((Vector3d *)puVar12 != &local_198) {
                  lVar13 = 0;
                  do {
                    local_198.super_Vector<double,_3U>.data_[lVar13] =
                         *(double *)(puVar12 + lVar13 * 8);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
                StuntDouble::lab2Body(&local_178,pSVar14,&local_198);
                local_c8[2] = local_178.super_Vector<double,_3U>.data_[2];
                local_c8[0] = local_178.super_Vector<double,_3U>.data_[0];
                local_c8[1] = local_178.super_Vector<double,_3U>.data_[1];
                pVVar5 = (this->oldJi).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
                local_128[0] = 0.0;
                local_128[1] = 0.0;
                local_128[2] = 0.0;
                lVar13 = 0;
                do {
                  local_128[lVar13] = local_c8[lVar13] * dVar3 * 0.0004184;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_198.super_Vector<double,_3U>.data_[0] = 0.0;
                local_198.super_Vector<double,_3U>.data_[1] = 0.0;
                local_198.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_198.super_Vector<double,_3U>.data_[lVar13] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar13 * 8 + lVar15) +
                       local_128[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                dVar4 = local_150->first;
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                local_148[2] = 0.0;
                lVar13 = 0;
                do {
                  local_148[lVar13] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar13 * 8 + lVar15) *
                       dVar3 * dVar4;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_178.super_Vector<double,_3U>.data_[0] = 0.0;
                local_178.super_Vector<double,_3U>.data_[1] = 0.0;
                local_178.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_178.super_Vector<double,_3U>.data_[lVar13] =
                       local_198.super_Vector<double,_3U>.data_[lVar13] - local_148[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_58 = local_178.super_Vector<double,_3U>.data_[2];
                local_68 = local_178.super_Vector<double,_3U>.data_[0];
                dStack_60 = local_178.super_Vector<double,_3U>.data_[1];
                iVar20 = pSVar14->localIndex_;
                lVar13 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar14->storage_);
                *(double *)(lVar13 + 0x10 + (long)iVar20 * 0x18) =
                     local_178.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar13 + (long)iVar20 * 0x18);
                *pdVar2 = local_178.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_178.super_Vector<double,_3U>.data_[1];
              }
              ppSVar18 = ppSVar18 + 1;
              if (ppSVar18 ==
                  (pMVar11->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar14 = (StuntDouble *)0x0;
              }
              else {
                pSVar14 = *ppSVar18;
              }
              uVar17 = uVar17 + 1;
              lVar15 = lVar15 + 0x18;
            } while (pSVar14 != (StuntDouble *)0x0);
          }
          pMVar11 = SimInfo::nextMolecule
                              ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                               &local_158);
        } while (pMVar11 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
      uVar17 = local_f8;
      if (ABS(local_48 - (this->thermostat).first) <= this->chiTolerance) {
        iVar20 = (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x14])
                           (this);
        if ((char)iVar20 != '\0') break;
      }
      uVar19 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar19;
    } while ((int)uVar19 < this->maxIterNum_);
  }
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_150);
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    thermostat      = snap->getThermostat();
    RealType oldChi = thermostat.first;
    RealType prevChi;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:
    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve chi another half step using the temperature at t + dt/2
      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instaTemp / targetTemp - 1.0) / tt2;

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if ((fabs(prevChi - thermostat.first) <= chiTolerance) &&
          this->etaConverged())
        break;
    }

    // calculate integral of chidt
    thermostat.second += dt2 * thermostat.first;

    snap->setThermostat(thermostat);

    flucQ_->moveB();
    saveEta();
  }